

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  char (*in_RCX) [26];
  RefCountersImpl *this_00;
  string msg;
  string local_28;
  
  this->m_pObject = pObj;
  if (pObj != (DeviceContextVkImpl *)0x0) {
    this_00 = (pObj->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.
              super_ObjectBase<Diligent::IDeviceContextVk>.
              super_RefCountedObject<Diligent::IDeviceContextVk>.m_pRefCounters;
    if (this_00 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_28,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pObj->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                super_ObjectBase<Diligent::IDeviceContextVk>.
                super_RefCountedObject<Diligent::IDeviceContextVk>.m_pRefCounters;
    }
    RefCountersImpl::AddStrongRef(this_00);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }